

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::Expression::PropagationVisitor::visit<slang::ast::UnbasedUnsizedIntegerLiteral>
          (PropagationVisitor *this,UnbasedUnsizedIntegerLiteral *expr)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = bad(&expr->super_Expression);
  if (!bVar1) {
    bVar1 = Type::isError(this->newType);
    if (bVar1) {
      (expr->super_Expression).type.ptr = this->newType;
    }
    else {
      bVar1 = Type::isEquivalent(this->newType,(expr->super_Expression).type.ptr);
      bVar2 = Type::isFloating(this->newType);
      if ((((bVar2) && (bVar2 = Type::isFloating((expr->super_Expression).type.ptr), bVar2)) ||
          ((bVar2 = Type::isIntegral(this->newType), bVar2 &&
           (bVar2 = Type::isIntegral((expr->super_Expression).type.ptr), bVar2)))) ||
         ((bVar2 = Type::isString(this->newType), bVar2 ||
          ((expr->super_Expression).kind == ValueRange)))) {
        if (bVar1) {
          updateRange(this,&expr->super_Expression);
        }
        bVar2 = UnbasedUnsizedIntegerLiteral::propagateType
                          (expr,this->context,this->newType,this->opRange,this->conversionKind);
        if (bVar2) {
          (expr->super_Expression).constant = (ConstantValue *)0x0;
          return &expr->super_Expression;
        }
      }
      if (!bVar1) {
        expr = (UnbasedUnsizedIntegerLiteral *)
               ConversionExpression::makeImplicit
                         (this->context,this->newType,this->conversionKind,&expr->super_Expression,
                          this->parentExpr,this->opRange);
      }
    }
  }
  return &expr->super_Expression;
}

Assistant:

Expression& visit(T& expr) {
        if (expr.bad())
            return expr;

        if (newType.isError()) {
            expr.type = &newType;
            return expr;
        }

        // If the new type is equivalent to the old type, there's no need for a
        // conversion. Otherwise if both types are integral or both are real, we have to
        // check if the conversion should be pushed further down the tree. Otherwise we
        // should insert the implicit conversion here.
        bool needConversion = !newType.isEquivalent(*expr.type);
        if constexpr (requires { expr.propagateType(context, newType, opRange, conversionKind); }) {
            if ((newType.isFloating() && expr.type->isFloating()) ||
                (newType.isIntegral() && expr.type->isIntegral()) || newType.isString() ||
                expr.kind == ExpressionKind::ValueRange) {

                if (!needConversion) {
                    // If we don't need a conversion here we still need to call propagateType as
                    // one of our child expressions may still need conversion. However, we shouldn't
                    // pass along our given opRange since we didn't need the conversion here, so our
                    // parent operator isn't relevant. We should try to refigure an opRange for our
                    // most immediate parent expression instead.
                    updateRange(expr);
                }

                if (expr.propagateType(context, newType, opRange, conversionKind)) {
                    // We propagated the type successfully so we don't need a conversion.
                    // We should however clear out any constant value that may have been
                    // stored here, since it may no longer be valid given the new type.
                    needConversion = false;
                    expr.constant = nullptr;
                }
            }
        }

        Expression* result = &expr;
        if (needConversion) {
            result = &ConversionExpression::makeImplicit(context, newType, conversionKind, expr,
                                                         parentExpr, opRange);
        }

        return *result;
    }